

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

bool glslang::isSameInterface(TIntermSymbol *symbol,TIntermSymbol *unitSymbol)

{
  EShLanguage EVar1;
  EShLanguage EVar2;
  int iVar3;
  TShaderInterface TVar4;
  TShaderInterface TVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  bool local_29;
  EShLanguage unitStage;
  EShLanguage stage;
  TIntermSymbol *unitSymbol_local;
  TIntermSymbol *symbol_local;
  
  EVar1 = TIntermSymbol::getStage(symbol);
  EVar2 = TIntermSymbol::getStage(unitSymbol);
  if (EVar1 == EVar2) {
    iVar3 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    TVar4 = TType::getShaderInterface((TType *)CONCAT44(extraout_var,iVar3));
    iVar3 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    TVar5 = TType::getShaderInterface((TType *)CONCAT44(extraout_var_00,iVar3));
    if (TVar4 == TVar5) {
      return true;
    }
  }
  iVar3 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
  if ((((uint)*(undefined8 *)(CONCAT44(extraout_var_01,iVar3) + 8) & 0x7f) == 5) &&
     (iVar3 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(),
     ((uint)*(undefined8 *)(CONCAT44(extraout_var_02,iVar3) + 8) & 0x7f) == 5)) {
    return true;
  }
  iVar3 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
  if ((((uint)*(undefined8 *)(CONCAT44(extraout_var_03,iVar3) + 8) & 0x7f) == 6) &&
     (iVar3 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(),
     ((uint)*(undefined8 *)(CONCAT44(extraout_var_04,iVar3) + 8) & 0x7f) == 6)) {
    return true;
  }
  if ((((int)EVar1 < (int)EVar2) &&
      (iVar3 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(),
      ((uint)*(undefined8 *)(CONCAT44(extraout_var_05,iVar3) + 8) & 0x7f) == 4)) &&
     (iVar3 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(),
     ((uint)*(undefined8 *)(CONCAT44(extraout_var_06,iVar3) + 8) & 0x7f) == 3)) {
    return true;
  }
  local_29 = false;
  if ((int)EVar2 < (int)EVar1) {
    iVar3 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
    local_29 = false;
    if (((uint)*(undefined8 *)(CONCAT44(extraout_var_07,iVar3) + 8) & 0x7f) == 3) {
      iVar3 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
      local_29 = ((uint)*(undefined8 *)(CONCAT44(extraout_var_08,iVar3) + 8) & 0x7f) == 4;
    }
  }
  return local_29;
}

Assistant:

static inline bool isSameInterface(TIntermSymbol* symbol, TIntermSymbol* unitSymbol) {
    EShLanguage stage = symbol->getStage();
    EShLanguage unitStage = unitSymbol->getStage();
    return // 1) same stage and same shader interface
        (stage == unitStage && symbol->getType().getShaderInterface() == unitSymbol->getType().getShaderInterface()) ||
        // 2) accross stages and both are uniform or buffer
        (symbol->getQualifier().storage == EvqUniform  && unitSymbol->getQualifier().storage == EvqUniform) ||
        (symbol->getQualifier().storage == EvqBuffer   && unitSymbol->getQualifier().storage == EvqBuffer) ||
        // 3) in/out matched across stage boundary
        (stage < unitStage && symbol->getQualifier().storage == EvqVaryingOut  && unitSymbol->getQualifier().storage == EvqVaryingIn) ||
        (unitStage < stage && symbol->getQualifier().storage == EvqVaryingIn && unitSymbol->getQualifier().storage == EvqVaryingOut);
}